

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

bool __thiscall ADSBExchangeConnection::InitCurl(ADSBExchangeConnection *this)

{
  bool bVar1;
  curl_slist *pcVar2;
  LTError *this_00;
  string theKey;
  string local_38;
  
  std::__cxx11::string::string((string *)&theKey,(string *)&dataRefs.sADSBExAPIKey);
  if (theKey._M_string_length == 0) {
    (this->apiKey)._M_string_length = 0;
    *(this->apiKey)._M_dataplus._M_p = '\0';
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x1ab,"InitCurl",logERR,
             "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
            );
    }
    CreateMsgWindow(12.0,logERR,
                    "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
                   );
    bVar1 = false;
    (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
      _vptr_LTChannel[7])(this,0,1);
    goto LAB_0013c776;
  }
  bVar1 = LTOnlineChannel::InitCurl((LTOnlineChannel *)this);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0013c776;
  }
  curl_easy_setopt((this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.pCurl,
                   0x4e6f,ReceiveHeader);
  if (this->slistKey == (curl_slist *)0x0) {
LAB_0013c686:
    std::__cxx11::string::_M_assign((string *)&this->apiKey);
    if (this->slistKey != (curl_slist *)0x0) {
      curl_slist_free_all();
      this->slistKey = (curl_slist *)0x0;
    }
    std::__cxx11::string::string((string *)&local_38,(string *)&this->apiKey);
    pcVar2 = MakeCurlSList(&local_38);
    this->slistKey = pcVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = std::operator!=(&theKey,&this->apiKey);
    if (bVar1) goto LAB_0013c686;
  }
  if (this->slistKey == (curl_slist *)0x0) {
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                     ,0x1c2,"InitCurl",logFATAL,"ASSERT FAILED: %s","slistKey");
    __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = true;
  curl_easy_setopt((this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.pCurl,
                   0x2727);
LAB_0013c776:
  std::__cxx11::string::~string((string *)&theKey);
  return bVar1;
}

Assistant:

bool ADSBExchangeConnection::InitCurl ()
{
    // we require an API key
    const std::string theKey (dataRefs.GetADSBExAPIKey());
    if (theKey.empty()) {
        apiKey.clear();
        SHOW_MSG(logERR, ERR_ADSBEX_NO_KEY_DEF);
        SetValid(false);
        return false;
    }
    
    // let's do the standard CURL init first
    if (!LTOnlineChannel::InitCurl())
        return false;

    // read headers
    curl_easy_setopt(pCurl, CURLOPT_HEADERFUNCTION, ReceiveHeader);

    // did the API key change?
    if (!slistKey || theKey != apiKey) {
        apiKey = theKey;
        if (slistKey) {
            curl_slist_free_all(slistKey);
            slistKey = NULL;
        }
        slistKey = MakeCurlSList(apiKey);
    }
    
    // now add/overwrite the key
    LOG_ASSERT(slistKey);
    curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, slistKey);
    return true;
}